

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ivyFraig.c
# Opt level: O1

void Ivy_FraigAddClausesMux(Ivy_FraigMan_t *p,Ivy_Obj_t *pNode)

{
  uint uVar1;
  uint uVar2;
  undefined4 uVar3;
  Ivy_FraigMan_t *pIVar4;
  int iVar5;
  int iVar6;
  Ivy_Obj_t *pIVar7;
  uint uVar8;
  uint uVar9;
  int pLits [4];
  Ivy_Obj_t *pNodeE;
  Ivy_Obj_t *pNodeT;
  uint local_88;
  uint local_84;
  uint local_80;
  lit local_7c [3];
  ulong local_70;
  uint local_64;
  uint local_60;
  uint local_5c;
  ulong local_58;
  ulong local_50;
  Ivy_FraigMan_t *local_48;
  Ivy_Obj_t *local_40;
  Ivy_Obj_t *local_38;
  
  if (((ulong)pNode & 1) != 0) {
    __assert_fail("!Ivy_IsComplement( pNode )",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/ivy/ivyFraig.c"
                  ,0x935,"void Ivy_FraigAddClausesMux(Ivy_FraigMan_t *, Ivy_Obj_t *)");
  }
  local_48 = p;
  iVar5 = Ivy_ObjIsMuxType(pNode);
  if (iVar5 == 0) {
    __assert_fail("Ivy_ObjIsMuxType( pNode )",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/ivy/ivyFraig.c"
                  ,0x936,"void Ivy_FraigAddClausesMux(Ivy_FraigMan_t *, Ivy_Obj_t *)");
  }
  pIVar7 = Ivy_ObjRecognizeMux(pNode,&local_38,&local_40);
  pIVar4 = local_48;
  local_70 = (ulong)*(uint *)&pIVar7->pNextFan0;
  uVar1 = *(uint *)(((ulong)local_38 & 0xfffffffffffffffe) + 0x28);
  local_50 = (ulong)*(uint *)(((ulong)local_40 & 0xfffffffffffffffe) + 0x28);
  uVar9 = (uint)local_38 & 1;
  uVar8 = *(uint *)&pIVar7->pNextFan0 * 2 + 1;
  local_84 = uVar9 + uVar1 * 2 ^ 1;
  uVar2 = *(int *)&pNode->pNextFan0 * 2;
  local_88 = uVar8;
  local_80 = uVar2;
  local_5c = local_84;
  iVar5 = sat_solver_addclause(local_48->pSat,(lit *)&local_88,local_7c);
  if (iVar5 == 0) {
    __assert_fail("RetValue",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/ivy/ivyFraig.c"
                  ,0x94e,"void Ivy_FraigAddClausesMux(Ivy_FraigMan_t *, Ivy_Obj_t *)");
  }
  local_84 = uVar1 * 2 | uVar9;
  uVar9 = uVar2 | 1;
  local_88 = uVar8;
  local_80 = uVar9;
  local_60 = local_84;
  local_58 = (ulong)uVar1;
  iVar5 = sat_solver_addclause(pIVar4->pSat,(lit *)&local_88,local_7c);
  if (iVar5 != 0) {
    uVar8 = (uint)local_40 & 1;
    uVar1 = (int)local_70 * 2;
    iVar5 = (int)local_50;
    local_84 = uVar8 + iVar5 * 2 ^ 1;
    local_70 = CONCAT44(local_70._4_4_,uVar2);
    local_88 = uVar1;
    local_80 = uVar2;
    local_64 = local_84;
    iVar6 = sat_solver_addclause(pIVar4->pSat,(lit *)&local_88,local_7c);
    if (iVar6 == 0) {
      __assert_fail("RetValue",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/ivy/ivyFraig.c"
                    ,0x958,"void Ivy_FraigAddClausesMux(Ivy_FraigMan_t *, Ivy_Obj_t *)");
    }
    uVar8 = iVar5 * 2 | uVar8;
    local_88 = uVar1;
    local_84 = uVar8;
    local_80 = uVar9;
    iVar6 = sat_solver_addclause(pIVar4->pSat,(lit *)&local_88,local_7c);
    if (iVar6 == 0) {
      __assert_fail("RetValue",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/ivy/ivyFraig.c"
                    ,0x95d,"void Ivy_FraigAddClausesMux(Ivy_FraigMan_t *, Ivy_Obj_t *)");
    }
    uVar3 = (undefined4)local_70;
    if ((int)local_58 != iVar5) {
      local_88 = local_60;
      local_84 = uVar8;
      local_80 = uVar9;
      iVar5 = sat_solver_addclause(pIVar4->pSat,(lit *)&local_88,local_7c);
      if (iVar5 == 0) {
        __assert_fail("RetValue",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/ivy/ivyFraig.c"
                      ,0x970,"void Ivy_FraigAddClausesMux(Ivy_FraigMan_t *, Ivy_Obj_t *)");
      }
      local_88 = local_5c;
      local_84 = local_64;
      local_80 = uVar3;
      iVar5 = sat_solver_addclause(pIVar4->pSat,(lit *)&local_88,local_7c);
      if (iVar5 == 0) {
        __assert_fail("RetValue",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/ivy/ivyFraig.c"
                      ,0x975,"void Ivy_FraigAddClausesMux(Ivy_FraigMan_t *, Ivy_Obj_t *)");
      }
    }
    return;
  }
  __assert_fail("RetValue",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/ivy/ivyFraig.c"
                ,0x953,"void Ivy_FraigAddClausesMux(Ivy_FraigMan_t *, Ivy_Obj_t *)");
}

Assistant:

void Ivy_FraigAddClausesMux( Ivy_FraigMan_t * p, Ivy_Obj_t * pNode )
{
    Ivy_Obj_t * pNodeI, * pNodeT, * pNodeE;
    int pLits[4], RetValue, VarF, VarI, VarT, VarE, fCompT, fCompE;

    assert( !Ivy_IsComplement( pNode ) );
    assert( Ivy_ObjIsMuxType( pNode ) );
    // get nodes (I = if, T = then, E = else)
    pNodeI = Ivy_ObjRecognizeMux( pNode, &pNodeT, &pNodeE );
    // get the variable numbers
    VarF = Ivy_ObjSatNum(pNode);
    VarI = Ivy_ObjSatNum(pNodeI);
    VarT = Ivy_ObjSatNum(Ivy_Regular(pNodeT));
    VarE = Ivy_ObjSatNum(Ivy_Regular(pNodeE));
    // get the complementation flags
    fCompT = Ivy_IsComplement(pNodeT);
    fCompE = Ivy_IsComplement(pNodeE);

    // f = ITE(i, t, e)

    // i' + t' + f
    // i' + t  + f'
    // i  + e' + f
    // i  + e  + f'

    // create four clauses
    pLits[0] = toLitCond(VarI, 1);
    pLits[1] = toLitCond(VarT, 1^fCompT);
    pLits[2] = toLitCond(VarF, 0);
    RetValue = sat_solver_addclause( p->pSat, pLits, pLits + 3 );
    assert( RetValue );
    pLits[0] = toLitCond(VarI, 1);
    pLits[1] = toLitCond(VarT, 0^fCompT);
    pLits[2] = toLitCond(VarF, 1);
    RetValue = sat_solver_addclause( p->pSat, pLits, pLits + 3 );
    assert( RetValue );
    pLits[0] = toLitCond(VarI, 0);
    pLits[1] = toLitCond(VarE, 1^fCompE);
    pLits[2] = toLitCond(VarF, 0);
    RetValue = sat_solver_addclause( p->pSat, pLits, pLits + 3 );
    assert( RetValue );
    pLits[0] = toLitCond(VarI, 0);
    pLits[1] = toLitCond(VarE, 0^fCompE);
    pLits[2] = toLitCond(VarF, 1);
    RetValue = sat_solver_addclause( p->pSat, pLits, pLits + 3 );
    assert( RetValue );

    // two additional clauses
    // t' & e' -> f'
    // t  & e  -> f 

    // t  + e   + f'
    // t' + e'  + f 

    if ( VarT == VarE )
    {
//        assert( fCompT == !fCompE );
        return;
    }

    pLits[0] = toLitCond(VarT, 0^fCompT);
    pLits[1] = toLitCond(VarE, 0^fCompE);
    pLits[2] = toLitCond(VarF, 1);
    RetValue = sat_solver_addclause( p->pSat, pLits, pLits + 3 );
    assert( RetValue );
    pLits[0] = toLitCond(VarT, 1^fCompT);
    pLits[1] = toLitCond(VarE, 1^fCompE);
    pLits[2] = toLitCond(VarF, 0);
    RetValue = sat_solver_addclause( p->pSat, pLits, pLits + 3 );
    assert( RetValue );
}